

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.h
# Opt level: O2

void __thiscall
oout::NamedTest::NamedTest<oout::ContainMatch,oout::ContainMatch>
          (NamedTest *this,string *name,shared_ptr<const_oout::Text> *text,
          shared_ptr<const_oout::Match> *match,shared_ptr<oout::ContainMatch> *matches,
          shared_ptr<oout::ContainMatch> *matches_1)

{
  shared_ptr<const_oout::Text> local_48;
  shared_ptr<const_oout::Test> local_38;
  
  std::
  make_shared<oout::MatchTest_const,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::ContainMatch>const&,std::shared_ptr<oout::ContainMatch>const&>
            (&local_48,(shared_ptr<const_oout::Match> *)text,(shared_ptr<oout::ContainMatch> *)match
             ,matches);
  local_38.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  NamedTest(this,name,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

NamedTest(
		const std::string &name,
		const std::shared_ptr<const Text> &text,
		const std::shared_ptr<const Match> &match,
		const std::shared_ptr<T> & ... matches
	) : NamedTest(name, std::make_shared<const MatchTest>(text, match, matches...))
	{
	}